

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::
      make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str,pybind11::int_>
                (object *args_,str *args__1,int_ *args__2)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  handle *this;
  undefined8 uVar4;
  PyObject **ppPVar5;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_3UL> *__range2;
  int counter;
  size_t i;
  array<pybind11::object,_3UL> args;
  size_t size;
  tuple *result;
  undefined7 in_stack_fffffffffffffea8;
  return_value_policy in_stack_fffffffffffffeaf;
  array<pybind11::object,_3UL> *in_stack_fffffffffffffeb0;
  PyTypeObject *pPVar6;
  handle in_stack_fffffffffffffeb8;
  array<pybind11::object,_3UL> *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  tuple *in_stack_fffffffffffffed0;
  handle local_c0;
  iterator local_b8;
  iterator local_b0;
  iterator local_a8;
  array<pybind11::object,_3UL> *local_a0;
  int local_98;
  undefined1 local_91;
  ulong local_90;
  handle local_88;
  PyObject *local_80;
  handle local_78;
  PyObject *local_70;
  handle local_58;
  PyObject *local_50;
  object *local_48;
  array<pybind11::object,_3UL> local_40;
  undefined8 local_28;
  
  local_28 = 3;
  local_48 = local_40._M_elems;
  handle::handle(&local_58,(PyObject *)0x0);
  local_50 = (PyObject *)
             detail::pyobject_caster<pybind11::object>::cast
                       ((handle *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf,
                        in_stack_fffffffffffffeb8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffeb8);
  local_48 = local_40._M_elems + 1;
  handle::handle(&local_78,(PyObject *)0x0);
  local_70 = (PyObject *)
             detail::pyobject_caster<pybind11::str>::cast
                       ((handle *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf,
                        in_stack_fffffffffffffeb8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffeb8);
  local_48 = local_40._M_elems + 2;
  handle::handle(&local_88,(PyObject *)0x0);
  local_80 = (PyObject *)
             detail::pyobject_caster<pybind11::int_>::cast
                       ((handle *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf,
                        in_stack_fffffffffffffeb8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffeb8);
  local_90 = 0;
  while( true ) {
    uVar1 = local_90;
    sVar3 = std::array<pybind11::object,_3UL>::size(&local_40);
    if (sVar3 <= uVar1) {
      local_91 = 0;
      tuple::tuple(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_98 = 0;
      local_a0 = &local_40;
      local_a8 = std::array<pybind11::object,_3UL>::begin((array<pybind11::object,_3UL> *)0x39f6bc);
      local_b0 = std::array<pybind11::object,_3UL>::end((array<pybind11::object,_3UL> *)0x39f6d1);
      for (; local_a8 != local_b0; local_a8 = local_a8 + 1) {
        local_b8 = local_a8;
        local_c0 = object::release((object *)
                                   CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
        ppPVar5 = handle::ptr(&local_c0);
        pPVar6 = (PyTypeObject *)*ppPVar5;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar5)[1].ob_type)[local_98] = pPVar6;
        local_98 = local_98 + 1;
      }
      local_91 = 1;
      std::array<pybind11::object,_3UL>::~array(in_stack_fffffffffffffec0);
      return (tuple)in_RDI.super_handle.m_ptr;
    }
    this = &std::array<pybind11::object,_3UL>::operator[]
                      (in_stack_fffffffffffffeb0,
                       CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8))->super_handle;
    bVar2 = handle::operator_cast_to_bool(this);
    if (!bVar2) break;
    local_90 = local_90 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  cast_error::runtime_error
            ((cast_error *)in_stack_fffffffffffffeb0,
             (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  __cxa_throw(uVar4,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}